

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O3

void optimization::loop_unrolling::expand_loop(MirFunction *func,BasicBlk *blk,loop_info *info)

{
  iterator __position;
  pointer pVVar1;
  MirFunction *pMVar2;
  BasicBlk *pBVar3;
  bool bVar4;
  Op OVar5;
  LabelId LVar6;
  uint32_t uVar7;
  int iVar8;
  pointer puVar9;
  __uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> _Var10;
  VarId *pVVar11;
  Inst *pIVar12;
  undefined8 uVar13;
  loop_info *plVar14;
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  *p_Var15;
  Displayable DVar16;
  char cVar17;
  int iVar18;
  _Self __tmp_2;
  mapped_type *pmVar19;
  pair<mir::inst::Op,_int> pVar20;
  long *plVar21;
  pointer pVVar22;
  long lVar23;
  _Rb_tree_node_base *p_Var24;
  mapped_type *pmVar25;
  mapped_type *pmVar26;
  undefined4 extraout_var;
  _Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> _Var27;
  OpInst *this;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  _Var28;
  uint32_t *puVar29;
  ulong uVar30;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar32;
  _Self __tmp_1;
  char *pcVar33;
  Tag *pTVar34;
  pointer *__ptr;
  pointer puVar35;
  pointer puVar36;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar37;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<mir::inst::VarId> __l_02;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  insts;
  int extra_loop;
  VarId new_phi;
  Rewriter rwt;
  VarId cond;
  size_type __dnew_2;
  int extra_loop_start;
  VarId new_change_var;
  undefined1 local_2d8 [17];
  undefined6 uStack_2c7;
  undefined4 uStack_2c1;
  undefined1 uStack_2bd;
  undefined4 uStack_2bc;
  undefined1 local_2b8 [24];
  undefined8 uStack_2a0;
  BasicBlk *local_290;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_288;
  loop_info *local_280;
  allocator_type local_271;
  LabelId *local_270;
  int local_264;
  mapped_type *local_260;
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  *local_258;
  undefined1 local_250 [16];
  undefined1 local_240 [17];
  undefined6 uStack_22f;
  undefined1 uStack_229;
  undefined1 auStack_228 [16];
  pair<mir::inst::Op,_int> local_218;
  pair<mir::inst::Op,_int> local_210;
  size_t local_208;
  undefined **local_200;
  uint32_t local_1f8;
  undefined **local_1f0;
  uint32_t local_1e8;
  undefined **local_1e0;
  uint32_t local_1d8;
  int local_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  _Base_ptr local_1a8;
  undefined1 local_1a0 [16];
  pair<mir::inst::Op,_int> local_190;
  Displayable local_188;
  undefined1 local_180 [16];
  undefined1 local_170 [9];
  undefined2 local_167;
  Op local_160;
  int local_11c;
  undefined1 local_118 [16];
  pointer local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_100;
  _Alloc_hider local_f0;
  tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> local_e8;
  undefined1 local_e0 [16];
  pointer local_d0;
  pointer puStack_c8;
  undefined **local_c0;
  JumpInstructionKind local_b8;
  bool local_a0;
  undefined8 local_98;
  JumpKind local_90;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_80;
  VarId local_78;
  undefined1 local_68;
  VarId *local_60;
  MirFunction *local_58;
  undefined **local_50;
  uint32_t local_48;
  undefined **local_40;
  uint32_t local_38;
  
  pTVar34 = (Tag *)&info->loop_start;
  local_280 = info;
  local_270 = (LabelId *)pTVar34;
  pmVar19 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at(&func->basic_blks,(key_type *)pTVar34);
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar34);
  local_118._8_8_ = &aStack_100;
  local_118._0_8_ = &PTR__Tag_001eaf88;
  local_108 = (pointer)0x0;
  aStack_100._M_allocated_capacity = aStack_100._M_allocated_capacity & 0xffffffffffffff00;
  local_f0._M_p._0_1_ = 1;
  AixLog::operator<<((ostream *)local_118,pTVar34);
  local_2b8._8_8_ = std::chrono::_V2::system_clock::now();
  local_2b8._0_8_ = &PTR__Timestamp_001eaf58;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)local_2b8,(Timestamp *)pTVar34);
  pMVar2 = (MirFunction *)(local_240 + 0x10);
  local_240[0x10] = 0x65;
  uStack_22f = 0x5f646e617078;
  uStack_229 = 0x6c;
  auStack_228[0] = 0x6f;
  auStack_228._1_2_ = 0x706f;
  local_240._8_8_ = (BasicBlk *)0xb;
  auStack_228[3] = _S_red >> 0x18;
  local_2d8._0_8_ = local_2d8 + 0x10;
  local_78.super_Displayable._vptr_Displayable = (_func_int **)0x6a;
  local_290 = blk;
  local_240._0_8_ = pMVar2;
  local_58 = func;
  pVar20 = (pair<mir::inst::Op,_int>)
           std::__cxx11::string::_M_create((ulong *)local_2d8,(ulong)&local_78);
  DVar16._vptr_Displayable = local_78.super_Displayable._vptr_Displayable;
  local_2d8[0x10] = SUB81(local_78.super_Displayable._vptr_Displayable,0);
  uStack_2c7 = (undefined6)((ulong)local_78.super_Displayable._vptr_Displayable >> 8);
  uStack_2c1._0_1_ = (undefined1)((ulong)local_78.super_Displayable._vptr_Displayable >> 0x38);
  pcVar33 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2d8._0_8_ = pVar20;
  memcpy((void *)pVar20,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  *(undefined1 *)((long)pVar20 + (long)DVar16._vptr_Displayable) = 0;
  local_1b8._0_8_ = &PTR__Function_001eafb8;
  if ((MirFunction *)local_240._0_8_ == pMVar2) {
    local_1a0._8_8_ =
         CONCAT44(auStack_228._4_4_,
                  CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0])));
    local_1b8._8_8_ = local_1a0;
  }
  else {
    local_1b8._8_8_ = local_240._0_8_;
  }
  local_1a0._1_6_ = uStack_22f;
  local_1a0[0] = local_240[0x10];
  local_1a0[7] = uStack_229;
  local_1a8 = (_Base_ptr)local_240._8_8_;
  local_240._8_8_ = (BasicBlk *)0x0;
  local_240[0x10] = Add;
  if (local_2d8._0_8_ == (long)local_2d8 + 0x10) {
    local_180._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
    local_190 = (pair<mir::inst::Op,_int>)local_180;
  }
  else {
    local_190.first = local_2d8._0_4_;
    local_190.second = local_2d8._4_4_;
  }
  local_180._1_6_ = uStack_2c7;
  local_180[0] = local_2d8[0x10];
  local_180[7] = (undefined1)uStack_2c1;
  local_188._vptr_Displayable = DVar16._vptr_Displayable;
  local_2d8._8_8_ = (pointer)0x0;
  local_2d8[0x10] = 0;
  local_170._0_8_ = (pointer)0x13e;
  local_170[8] = false;
  local_2d8._0_8_ = (long)local_2d8 + 0x10;
  local_240._0_8_ = pMVar2;
  AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar33);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::clog,"unroll loop starts at  ",0x17);
  plVar21 = (long *)std::ostream::operator<<(&std::clog,*local_270);
  cVar17 = std::ios::widen((char)*(undefined8 *)(*plVar21 + -0x18) + (char)plVar21);
  pTVar34 = (Tag *)(ulong)(uint)(int)cVar17;
  std::ostream::put((char)plVar21);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_1b8);
  if (local_2d8._0_8_ != (long)local_2d8 + 0x10) {
    pTVar34 = (Tag *)(CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
    operator_delete((void *)local_2d8._0_8_,(ulong)pTVar34);
  }
  if ((MirFunction *)local_240._0_8_ != pMVar2) {
    pTVar34 = (Tag *)(CONCAT17(uStack_229,CONCAT61(uStack_22f,local_240[0x10])) + 1);
    operator_delete((void *)local_240._0_8_,(ulong)pTVar34);
  }
  local_118._0_8_ = &PTR__Tag_001eaf88;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._8_8_ != &aStack_100) {
    pTVar34 = (Tag *)(aStack_100._M_allocated_capacity + 1);
    operator_delete((void *)local_118._8_8_,(ulong)pTVar34);
  }
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar34);
  local_118._0_8_ = &PTR__Tag_001eaf88;
  local_118._8_8_ = &aStack_100;
  local_108 = (pointer)0x0;
  aStack_100._M_allocated_capacity = aStack_100._M_allocated_capacity & 0xffffffffffffff00;
  local_f0._M_p._0_1_ = 1;
  AixLog::operator<<((ostream *)local_118,pTVar34);
  local_2b8._8_8_ = std::chrono::_V2::system_clock::now();
  local_2b8._0_8_ = &PTR__Timestamp_001eaf58;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)local_2b8,(Timestamp *)pTVar34);
  local_240[0x10] = 0x65;
  uStack_22f = 0x5f646e617078;
  uStack_229 = 0x6c;
  auStack_228[0] = 0x6f;
  auStack_228._1_2_ = 0x706f;
  local_240._8_8_ = (BasicBlk *)0xb;
  auStack_228[3] = _S_red >> 0x18;
  local_2d8._0_8_ = local_2d8 + 0x10;
  local_78.super_Displayable._vptr_Displayable = (_func_int **)0x6a;
  local_260 = pmVar19;
  local_240._0_8_ = pMVar2;
  pVar20 = (pair<mir::inst::Op,_int>)
           std::__cxx11::string::_M_create((ulong *)local_2d8,(ulong)&local_78);
  DVar16._vptr_Displayable = local_78.super_Displayable._vptr_Displayable;
  local_2d8[0x10] = SUB81(local_78.super_Displayable._vptr_Displayable,0);
  uStack_2c7 = (undefined6)((ulong)local_78.super_Displayable._vptr_Displayable >> 8);
  uStack_2c1._0_1_ = (undefined1)((ulong)local_78.super_Displayable._vptr_Displayable >> 0x38);
  pcVar33 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2d8._0_8_ = pVar20;
  memcpy((void *)pVar20,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  plVar14 = local_280;
  *(undefined1 *)((long)pVar20 + (long)DVar16._vptr_Displayable) = 0;
  local_1b8._0_8_ = &PTR__Function_001eafb8;
  if ((MirFunction *)local_240._0_8_ == pMVar2) {
    local_1a0._8_8_ =
         CONCAT44(auStack_228._4_4_,
                  CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0])));
    local_1b8._8_8_ = local_1a0;
  }
  else {
    local_1b8._8_8_ = local_240._0_8_;
  }
  local_1a0._1_6_ = uStack_22f;
  local_1a0[0] = local_240[0x10];
  local_1a0[7] = uStack_229;
  local_1a8 = (_Base_ptr)local_240._8_8_;
  local_240._8_8_ = (BasicBlk *)0x0;
  local_240[0x10] = Add;
  if (local_2d8._0_8_ == (long)local_2d8 + 0x10) {
    local_180._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
    local_190 = (pair<mir::inst::Op,_int>)local_180;
  }
  else {
    local_190.first = local_2d8._0_4_;
    local_190.second = local_2d8._4_4_;
  }
  local_180._1_6_ = uStack_2c7;
  local_180[0] = local_2d8[0x10];
  local_180[7] = (undefined1)uStack_2c1;
  local_188._vptr_Displayable = DVar16._vptr_Displayable;
  local_2d8._8_8_ = (pointer)0x0;
  local_2d8[0x10] = 0;
  local_170._0_8_ = (pointer)0x13f;
  local_170[8] = false;
  local_2d8._0_8_ = (long)local_2d8 + 0x10;
  local_240._0_8_ = pMVar2;
  AixLog::operator<<((ostream *)local_1b8,(Function *)pcVar33);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"init_val: ",10);
  (**(plVar14->init_var).super_Displayable._vptr_Displayable)(&plVar14->init_var,&std::clog);
  cVar17 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  pTVar34 = (Tag *)(ulong)(uint)(int)cVar17;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_1b8);
  if (local_2d8._0_8_ != (long)local_2d8 + 0x10) {
    pTVar34 = (Tag *)(CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
    operator_delete((void *)local_2d8._0_8_,(ulong)pTVar34);
  }
  if ((MirFunction *)local_240._0_8_ != pMVar2) {
    pTVar34 = (Tag *)(CONCAT17(uStack_229,CONCAT61(uStack_22f,local_240[0x10])) + 1);
    operator_delete((void *)local_240._0_8_,(ulong)pTVar34);
  }
  local_118._0_8_ = &PTR__Tag_001eaf88;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._8_8_ != &aStack_100) {
    pTVar34 = (Tag *)(aStack_100._M_allocated_capacity + 1);
    operator_delete((void *)local_118._8_8_,(ulong)pTVar34);
  }
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar34);
  local_240._8_8_ = auStack_228;
  local_240._0_8_ = &PTR__Tag_001eaf88;
  local_240[0x10] = Add;
  uStack_22f = 0;
  uStack_229 = 0;
  auStack_228[0] = _S_red;
  local_218.first._0_1_ = 1;
  AixLog::operator<<((ostream *)local_240,pTVar34);
  local_258 = (_Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
               *)&func->basic_blks;
  local_78._8_8_ = std::chrono::_V2::system_clock::now();
  local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001eaf58;
  local_68 = 0;
  AixLog::operator<<((ostream *)&local_78,(Timestamp *)pTVar34);
  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2d8 + 0x10);
  local_2d8[0x10] = 0x65;
  uStack_2c7 = 0x5f646e617078;
  uStack_2c1 = 0x706f6f6c;
  local_2d8._8_8_ = (pointer)0xb;
  uStack_2bd = 0;
  pVVar1 = (pointer)(local_2b8 + 0x10);
  local_1b8._0_8_ = (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x6a;
  local_2d8._0_8_ = paVar32;
  local_2b8._0_8_ = pVVar1;
  local_60 = &plVar14->init_var;
  pVVar22 = (pointer)std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)local_1b8);
  uVar13 = local_1b8._0_8_;
  local_2b8._16_8_ = local_1b8._0_8_;
  pcVar33 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2b8._0_8_ = pVVar22;
  memcpy(pVVar22,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  *(undefined1 *)((long)&(pVVar22->super_Displayable)._vptr_Displayable + uVar13) = 0;
  local_118._0_8_ = &PTR__Function_001eafb8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ == paVar32) {
    aStack_100._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
    local_118._8_8_ = &aStack_100;
  }
  else {
    local_118._8_8_ = local_2d8._0_8_;
  }
  aStack_100._M_allocated_capacity._1_6_ = uStack_2c7;
  aStack_100._M_local_buf[0] = local_2d8[0x10];
  aStack_100._M_local_buf[7] = (undefined1)uStack_2c1;
  local_f0._M_p = local_e0;
  local_108 = (pointer)local_2d8._8_8_;
  local_2d8._8_8_ = (pointer)0x0;
  local_2d8[0x10] = 0;
  if ((pointer)local_2b8._0_8_ == pVVar1) {
    local_e0._8_8_ = uStack_2a0;
  }
  else {
    local_f0._M_p = (pointer)local_2b8._0_8_;
  }
  local_e0._0_8_ = local_2b8._16_8_;
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)uVar13;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  local_d0 = (pointer)0x140;
  puStack_c8 = (pointer)((ulong)puStack_c8 & 0xffffffffffffff00);
  local_2d8._0_8_ = paVar32;
  local_2b8._0_8_ = pVVar1;
  AixLog::operator<<((ostream *)local_118,(Function *)pcVar33);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"change : ",9);
  OVar5 = (plVar14->init_var).id;
  local_160 = (plVar14->change).first;
  local_1b8._8_8_ = &PTR_display_001eb100;
  local_1a8 = (_Base_ptr)CONCAT44(local_1a8._4_4_,OVar5);
  local_1b8._0_8_ = &PTR_display_001ed048;
  local_1a0._8_8_ = &PTR_display_001eb100;
  local_190.first = OVar5;
  local_1a0._0_8_ = &PTR_display_001ecf98;
  local_188._vptr_Displayable._0_3_ = 0x101;
  local_170[8] = false;
  local_180._8_4_ = (plVar14->change).second;
  local_80._M_head_impl = (Inst *)&PTR_display_001ecf98;
  local_180._0_8_ = &PTR_display_001ecf98;
  local_167._0_1_ = Lsl;
  local_167._1_1_ = '\0';
  mir::inst::OpInst::display((OpInst *)local_1b8,(ostream *)&std::clog);
  cVar17 = std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  pTVar34 = (Tag *)(ulong)(uint)(int)cVar17;
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_118);
  if ((pointer)local_2b8._0_8_ != pVVar1) {
    pTVar34 = (Tag *)((long)&((Displayable *)local_2b8._16_8_)->_vptr_Displayable + 1);
    operator_delete((void *)local_2b8._0_8_,(ulong)pTVar34);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2d8 + 0x10)) {
    pTVar34 = (Tag *)(CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
    operator_delete((void *)local_2d8._0_8_,(ulong)pTVar34);
  }
  local_240._0_8_ = &PTR__Tag_001eaf88;
  if ((BasicBlk *)local_240._8_8_ != (BasicBlk *)auStack_228) {
    pTVar34 = (Tag *)(CONCAT44(auStack_228._4_4_,
                               CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0])))
                     + 1);
    operator_delete((void *)local_240._8_8_,(ulong)pTVar34);
  }
  local_250[0] = (ostream)0x0;
  AixLog::operator<<((ostream *)local_250,(Severity *)pTVar34);
  local_240._0_8_ = &PTR__Tag_001eaf88;
  local_240._8_8_ = auStack_228;
  local_240[0x10] = Add;
  uStack_22f = 0;
  uStack_229 = 0;
  auStack_228[0] = _S_red;
  local_218.first._0_1_ = 1;
  AixLog::operator<<((ostream *)local_240,pTVar34);
  local_78._8_8_ = std::chrono::_V2::system_clock::now();
  local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001eaf58;
  local_68 = 0;
  AixLog::operator<<((ostream *)&local_78,(Timestamp *)pTVar34);
  paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_2d8 + 0x10);
  local_2d8[0x10] = 0x65;
  uStack_2c7 = 0x5f646e617078;
  uStack_2c1 = 0x706f6f6c;
  local_2d8._8_8_ = (pointer)0xb;
  uStack_2bd = 0;
  local_1b8._0_8_ = (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x6a;
  local_2d8._0_8_ = paVar32;
  local_2b8._0_8_ = pVVar1;
  pVVar22 = (pointer)std::__cxx11::string::_M_create((ulong *)local_2b8,(ulong)local_1b8);
  uVar13 = local_1b8._0_8_;
  local_2b8._16_8_ = local_1b8._0_8_;
  pcVar33 = 
  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
  ;
  local_2b8._0_8_ = pVVar22;
  memcpy(pVVar22,
         "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
         ,0x6a);
  p_Var15 = local_258;
  plVar14 = local_280;
  *(undefined1 *)((long)&(pVVar22->super_Displayable)._vptr_Displayable + uVar13) = 0;
  local_118._0_8_ = &PTR__Function_001eafb8;
  local_118._8_8_ = &aStack_100;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ == paVar32) {
    aStack_100._8_8_ = CONCAT44(uStack_2bc,CONCAT13(uStack_2bd,uStack_2c1._1_3_));
  }
  else {
    local_118._8_8_ = local_2d8._0_8_;
  }
  aStack_100._M_allocated_capacity._1_6_ = uStack_2c7;
  aStack_100._M_local_buf[0] = local_2d8[0x10];
  aStack_100._M_local_buf[7] = (undefined1)uStack_2c1;
  local_f0._M_p = local_e0;
  local_108 = (pointer)local_2d8._8_8_;
  local_2d8._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_2d8[0x10] = 0;
  if ((pointer)local_2b8._0_8_ == pVVar1) {
    local_e0._8_8_ = uStack_2a0;
  }
  else {
    local_f0._M_p = (pointer)local_2b8._0_8_;
  }
  local_e0._0_8_ = local_2b8._16_8_;
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)uVar13;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = local_2b8._16_8_ & 0xffffffffffffff00;
  local_d0 = (pointer)0x144;
  puStack_c8 = (pointer)((ulong)puStack_c8 & 0xffffffffffffff00);
  local_2d8._0_8_ = paVar32;
  local_2b8._0_8_ = pVVar1;
  AixLog::operator<<((ostream *)local_118,(Function *)pcVar33);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"continue when: ",0xf);
  local_160 = (plVar14->cmp).first;
  local_1b8._8_8_ = &PTR_display_001eb100;
  local_1a8 = (_Base_ptr)((ulong)local_1a8 & 0xffffffff00000000);
  local_1b8._0_8_ = &PTR_display_001ed048;
  local_1a0._8_8_ = &PTR_display_001eb100;
  local_190.first = (plVar14->init_var).id;
  local_1a0._0_8_ = local_80._M_head_impl;
  local_188._vptr_Displayable._0_3_ = 0x101;
  local_170[8] = true;
  local_180._8_8_ = &PTR_display_001eb100;
  local_170._0_4_ = (plVar14->cmp).second.id;
  local_180._0_8_ = local_80._M_head_impl;
  local_167._0_1_ = Lsl;
  local_167._1_1_ = '\0';
  mir::inst::OpInst::display((OpInst *)local_1b8,(ostream *)&std::clog);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  AixLog::Function::~Function((Function *)local_118);
  pBVar3 = local_290;
  if ((pointer)local_2b8._0_8_ != pVVar1) {
    operator_delete((void *)local_2b8._0_8_,
                    (ulong)((long)&((Displayable *)local_2b8._16_8_)->_vptr_Displayable + 1));
  }
  pMVar2 = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_2d8 + 0x10)) {
    operator_delete((void *)local_2d8._0_8_,
                    CONCAT17((undefined1)uStack_2c1,CONCAT61(uStack_2c7,local_2d8[0x10])) + 1);
  }
  local_240._0_8_ = &PTR__Tag_001eaf88;
  if ((BasicBlk *)local_240._8_8_ != (BasicBlk *)auStack_228) {
    operator_delete((void *)local_240._8_8_,
                    CONCAT44(auStack_228._4_4_,
                             CONCAT13(auStack_228[3],CONCAT21(auStack_228._1_2_,auStack_228[0]))) +
                    1);
  }
  local_1e8 = (plVar14->init_var).id;
  local_1f8 = (plVar14->phi_var).id;
  local_1d8 = (plVar14->change_var).id;
  local_240._0_8_ = pMVar2;
  local_240._8_8_ = pBVar3;
  auStack_228[0] = _S_red;
  auStack_228._1_2_ = _S_red >> 8;
  auStack_228[3] = _S_red >> 0x18;
  auStack_228._8_8_ = (_Base_ptr)0x0;
  local_218 = (pair<mir::inst::Op,_int>)auStack_228;
  local_208 = 0;
  local_200 = &PTR_display_001eb100;
  local_1f0 = &PTR_display_001eb100;
  local_1e0 = &PTR_display_001eb100;
  local_210 = local_218;
  lVar23 = std::_Rb_tree_decrement
                     (&(pMVar2->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  local_1d0 = *(int *)(lVar23 + 0x20);
  pmVar19 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var15,local_270);
  loop_info::rewrite_jump_cond(plVar14,pmVar19);
  p_Var24 = (_Rb_tree_node_base *)
            std::_Rb_tree_decrement
                      (&(pMVar2->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header);
  lVar23 = std::_Rb_tree_decrement(p_Var24);
  local_11c = *(int *)(lVar23 + 0x20) + 1;
  local_264 = *(int *)(lVar23 + 0x20) + 2;
  local_118._0_8_ = &PTR_display_001ed448;
  local_108 = (pointer)0x0;
  aStack_100._M_allocated_capacity = 0;
  aStack_100._8_8_ = 0;
  local_e0._0_8_ = 0;
  local_e0._8_8_ = 0;
  local_d0 = (pointer)0x0;
  puStack_c8 = (pointer)0x0;
  local_c0 = &PTR_display_001ed408;
  local_b8 = Undefined;
  local_a0 = false;
  local_98._0_4_ = -1;
  local_98._4_4_ = -1;
  local_90 = Undefined;
  local_f0._M_p = (pointer)&aStack_100;
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)&aStack_100;
  local_118._8_4_ = local_11c;
  local_1b8._0_4_ = local_11c;
  mir::inst::BasicBlk::BasicBlk((BasicBlk *)(local_1b8 + 8),(BasicBlk *)local_118);
  p_Var15 = local_258;
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_insert_unique<std::pair<int_const,mir::inst::BasicBlk>>
            (local_258,(pair<const_int,_mir::inst::BasicBlk> *)local_1b8);
  local_1b8._8_8_ = &PTR_display_001ed448;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_170);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1a0);
  local_118._0_8_ = &PTR_display_001ed448;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)(local_e0 + 8));
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_108);
  local_118._0_8_ = &PTR_display_001ed448;
  local_118._8_4_ = local_264;
  local_108 = (pointer)0x0;
  aStack_100._M_allocated_capacity = 0;
  aStack_100._8_8_ = 0;
  local_f0._M_p = (pointer)&aStack_100;
  local_e0._0_8_ = 0;
  local_e0._8_8_ = 0;
  local_d0 = (pointer)0x0;
  puStack_c8 = (pointer)0x0;
  local_c0 = &PTR_display_001ed408;
  local_b8 = Undefined;
  local_a0 = false;
  local_98._0_4_ = -1;
  local_98._4_4_ = -1;
  local_90 = Undefined;
  local_1b8._0_4_ = local_264;
  pBVar3 = (BasicBlk *)(local_1b8 + 8);
  local_e8.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)
       (_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)local_f0._M_p;
  mir::inst::BasicBlk::BasicBlk(pBVar3,(BasicBlk *)local_118);
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_insert_unique<std::pair<int_const,mir::inst::BasicBlk>>
            (p_Var15,(pair<const_int,_mir::inst::BasicBlk> *)local_1b8);
  local_1b8._8_8_ = &PTR_display_001ed448;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_170);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1a0);
  local_118._0_8_ = &PTR_display_001ed448;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)(local_e0 + 8));
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_108);
  pmVar25 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var15,&local_11c);
  pmVar19 = local_260;
  pmVar26 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var15,&local_264);
  local_118._4_4_ = local_290->id;
  local_118._0_4_ = pmVar19->id;
  __l._M_len = 2;
  __l._M_array = (iterator)local_118;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1b8,__l,(less<int> *)local_2d8,
             (allocator_type *)local_2b8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(pmVar25->preceding)._M_t);
  if (local_1a8 != (_Base_ptr)0x0) {
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1b8._8_4_;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_1a8;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_1a0._0_8_;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_1a0._8_8_;
    local_1a8->_M_parent = &(pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_header;
    (pmVar25->preceding)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_190;
    local_1a8 = (_Base_ptr)0x0;
    local_190.first = Add;
    local_190.second = 0;
    local_1a0._0_8_ = pBVar3;
    local_1a0._8_8_ = pBVar3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1b8);
  local_118._4_4_ = pmVar26->id;
  local_118._0_4_ = pmVar25->id;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_118;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1b8,__l_00,
             (less<int> *)local_2d8,(allocator_type *)local_2b8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(pmVar26->preceding)._M_t);
  if (local_1a8 != (_Base_ptr)0x0) {
    (pmVar26->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1b8._8_4_;
    (pmVar26->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_1a8;
    (pmVar26->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_1a0._0_8_;
    (pmVar26->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_1a0._8_8_;
    local_1a8->_M_parent = &(pmVar26->preceding)._M_t._M_impl.super__Rb_tree_header._M_header;
    (pmVar26->preceding)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_190;
    local_1a8 = (_Base_ptr)0x0;
    local_190.first = Add;
    local_190.second = 0;
    local_1a0._0_8_ = pBVar3;
    local_1a0._8_8_ = pBVar3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1b8);
  local_118._4_4_ = pmVar26->id;
  local_118._0_4_ = pmVar25->id;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_118;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1b8,__l_01,
             (less<int> *)local_2d8,(allocator_type *)local_2b8);
  local_270 = &(pmVar19->jump).bb_false;
  pmVar19 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var15,local_270);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            (&(pmVar19->preceding)._M_t);
  if (local_1a8 != (_Base_ptr)0x0) {
    (pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = local_1b8._8_4_;
    (pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = local_1a8;
    (pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)local_1a0._0_8_;
    (pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)local_1a0._8_8_;
    local_1a8->_M_parent = &(pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header._M_header;
    (pmVar19->preceding)._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_190;
    local_1a8 = (_Base_ptr)0x0;
    local_190.first = Add;
    local_190.second = 0;
    local_1a0._0_8_ = pBVar3;
    local_1a0._8_8_ = pBVar3;
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_1b8);
  puVar35 = (local_290->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (local_290->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar35 != puVar9) {
    do {
      local_1b8._0_4_ =
           (*(((puVar35->_M_t).
               super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
               super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
               super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
             _vptr_Displayable[6])();
      local_1b8._4_4_ = extraout_var;
      std::
      vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
      ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  *)&pmVar26->inst,
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_1b8);
      if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_1b8._0_8_
          != (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
        (**(code **)(*(_func_int **)local_1b8._0_8_ + 0x28))();
      }
      puVar35 = puVar35 + 1;
    } while (puVar35 != puVar9);
  }
  pmVar19 = local_260;
  LVar6 = pmVar26->id;
  iVar18 = *local_270;
  bVar4 = (local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_engaged;
  uVar7 = (local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
          _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
  (pmVar26->jump).kind = BrCond;
  if ((pmVar26->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    if (bVar4 != false) {
      (pmVar26->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
      _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      (pmVar26->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar7;
      (pmVar26->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
    }
  }
  else if (bVar4 == false) {
    (pmVar26->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = false;
  }
  else {
    (pmVar26->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = uVar7;
  }
  (pmVar26->jump).bb_true = LVar6;
  (pmVar26->jump).bb_false = iVar18;
  (pmVar26->jump).jump_kind = Loop;
  loop_info::rewrite_jump_cond(local_280,local_290);
  plVar14 = local_280;
  local_78.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  local_78.id = 0xffffffff;
  Rewriter::get_insts((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)local_2d8,(Rewriter *)local_240,local_280->unrolling_times,&local_78);
  local_40 = &PTR_display_001eb100;
  local_38 = (plVar14->init_var).id;
  loop_info::copy_var((loop_info *)local_250,(VarId *)plVar14);
  local_1b8._0_8_ = &PTR_display_001eb100;
  local_1b8._8_4_ = (plVar14->init_var).id;
  local_1a8 = (_Base_ptr)&PTR_display_001eb100;
  local_1a0._0_4_ = local_78.id;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1b8;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_2b8,__l_02,
             &local_271);
  _Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (_Head_base<0UL,_mir::inst::Inst_*,_false>)operator_new(0x40);
  local_118._0_8_ = local_2b8._0_8_;
  local_118._8_8_ = local_2b8._8_8_;
  local_108 = (pointer)local_2b8._16_8_;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  local_2b8._16_8_ = (pointer)0x0;
  *(undefined ***)((long)_Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8) =
       &PTR_display_001eb100;
  *(undefined4 *)((long)_Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x10)
       = local_250._8_4_;
  *(undefined ***)_Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       &PTR_display_001ed3a8;
  *(undefined ***)((long)_Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x18)
       = &PTR_display_001eb100;
  *(undefined4 *)((long)_Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x20)
       = local_250._8_4_;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             ((long)_Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 0x28),
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)local_118);
  local_1c8._0_8_ = _Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
  if ((_func_int **)local_118._0_8_ != (_func_int **)0x0) {
    local_288._M_head_impl =
         (Inst *)_Var27.super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
    operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
    local_1c8._0_8_ = local_288._M_head_impl;
  }
  local_288._M_head_impl = (Inst *)0x0;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)&pmVar25->inst,
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_1c8);
  if ((_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)local_1c8._0_8_ !=
      (Inst *)0x0) {
    (**(code **)(*(long *)local_1c8._0_8_ + 0x28))();
  }
  local_1c8._0_8_ = (Inst *)0x0;
  if ((PhiInst *)local_288._M_head_impl != (PhiInst *)0x0) {
    std::default_delete<mir::inst::PhiInst>::operator()
              ((default_delete<mir::inst::PhiInst> *)&local_288,(PhiInst *)local_288._M_head_impl);
  }
  local_288._M_head_impl = (Inst *)0x0;
  if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ - local_2b8._0_8_);
  }
  if ((local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  local_50 = &PTR_display_001eb100;
  local_48 = (local_290->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
             _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
  loop_info::copy_var((loop_info *)local_1c8,(VarId *)local_280);
  this = (OpInst *)operator_new(0x60);
  local_2b8._0_8_ = &PTR_display_001eb100;
  local_2b8._8_4_ = local_1c8._8_4_;
  local_1b8._8_8_ = &PTR_display_001eb100;
  local_1a8 = (_Base_ptr)CONCAT44(local_1a8._4_4_,local_250._8_4_);
  local_1b8._0_8_ = local_80._M_head_impl;
  local_1a0._0_3_ = 0x101;
  local_118._8_8_ = &PTR_display_001eb100;
  local_108 = (pointer)CONCAT44(local_108._4_4_,(local_280->cmp).second.id);
  local_118._0_8_ = local_80._M_head_impl;
  aStack_100._M_allocated_capacity._0_3_ = 0x101;
  mir::inst::OpInst::OpInst
            (this,(VarId *)local_2b8,(Value *)local_1b8,(Value *)local_118,(local_280->cmp).first);
  local_288._M_head_impl = (Inst *)this;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)&pmVar25->inst,
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)&local_288);
  pBVar3 = local_290;
  if ((OpInst *)local_288._M_head_impl != (OpInst *)0x0) {
    (*(((Inst *)&(local_288._M_head_impl)->super_Displayable)->super_Displayable)._vptr_Displayable
      [5])();
  }
  iVar18 = pmVar26->id;
  iVar8 = *local_270;
  (pmVar25->jump).kind = BrCond;
  if ((pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
    _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
    super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
  }
  (pmVar25->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
  super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_1c8._8_4_;
  (pmVar25->jump).bb_true = iVar18;
  (pmVar25->jump).bb_false = iVar8;
  (pmVar25->jump).jump_kind = Loop;
  if ((pBVar3->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  LVar6 = pmVar25->id;
  (pBVar3->jump).kind = BrCond;
  (pBVar3->jump).bb_true = pBVar3->id;
  (pBVar3->jump).bb_false = LVar6;
  (pBVar3->jump).jump_kind = Loop;
  _Var10._M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       (((pmVar26->inst).
         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t;
  iVar18 = (**(code **)(*(long *)_Var10._M_t.
                                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                 .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8))
                     (_Var10._M_t.
                      super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                      .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl);
  if (iVar18 != 7) {
    __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                  ,0x180,
                  "void optimization::loop_unrolling::expand_loop(mir::inst::MirFunction &, mir::inst::BasicBlk &, loop_info)"
                 );
  }
  _Var31._M_head_impl = (Inst *)0x0;
  if (*(undefined ***)
       _Var10._M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
       super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl == &PTR_display_001ed3a8) {
    _Var31._M_head_impl =
         (Inst *)_Var10._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
  }
  _Var28 = std::
           __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                     (*(long *)&_Var31._M_head_impl[1].dest.id,
                      *(long *)&_Var31._M_head_impl[2].super_Displayable,local_60);
  p_Var15 = local_258;
  pBVar3 = local_290;
  pVVar11 = *(VarId **)&_Var31._M_head_impl[2].super_Displayable;
  if ((_Var28._M_current + 1 != pVVar11) &&
     (lVar23 = (long)pVVar11 - (long)(_Var28._M_current + 1) >> 4, 0 < lVar23)) {
    uVar30 = lVar23 + 1;
    puVar29 = &_Var28._M_current[1].id;
    do {
      puVar29[-4] = *puVar29;
      uVar30 = uVar30 - 1;
      puVar29 = puVar29 + 4;
    } while (1 < uVar30);
  }
  __position._M_current = pVVar11 + -1;
  _Var31._M_head_impl[2].super_Displayable = (Displayable)__position._M_current;
  if (__position._M_current == *(VarId **)&_Var31._M_head_impl[2].dest.super_Displayable) {
    std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
    _M_realloc_insert<mir::inst::VarId_const&>
              ((vector<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)
               &_Var31._M_head_impl[1].dest.id,__position,(VarId *)local_250);
  }
  else {
    pVVar11[-1].super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
    pVVar11[-1].id = local_250._8_4_;
    _Var31._M_head_impl[2].super_Displayable = (Displayable)pVVar11;
  }
  puVar35 = (pBVar3->inst).
            super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar9 = (pBVar3->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar36 = puVar35;
  if (puVar9 != puVar35) {
    do {
      pIVar12 = (puVar36->_M_t).
                super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
      if (pIVar12 != (Inst *)0x0) {
        (*(pIVar12->super_Displayable)._vptr_Displayable[5])();
      }
      (puVar36->_M_t).super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
      _M_t.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
      super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl = (Inst *)0x0;
      puVar36 = puVar36 + 1;
    } while (puVar36 != puVar9);
    (local_290->inst).
    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar35;
    pmVar19 = local_260;
  }
  uVar13 = local_2d8._8_8_;
  if (local_2d8._0_8_ != local_2d8._8_8_) {
    local_290 = (BasicBlk *)&local_290->inst;
    paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2d8._0_8_;
    do {
      std::
      vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
      ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                  *)local_290,
                 (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 &paVar32->_M_allocated_capacity);
      paVar32 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(&paVar32->_M_allocated_capacity + 1);
    } while (paVar32 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)uVar13);
  }
  pmVar26 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)p_Var15,local_270);
  pVar37 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
           equal_range(&(pmVar26->preceding)._M_t,&(pmVar19->jump).bb_true);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
            (&(pmVar26->preceding)._M_t,(_Base_ptr)pVar37.first._M_node,
             (_Base_ptr)pVar37.second._M_node);
  if ((pmVar19->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  iVar18 = pmVar25->id;
  (pmVar19->jump).kind = BrCond;
  (pmVar19->jump).bb_false = iVar18;
  (pmVar19->jump).jump_kind = Undefined;
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             *)local_2d8);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
               *)(local_240 + 0x10));
  return;
}

Assistant:

void expand_loop(mir::inst::MirFunction& func, mir::inst::BasicBlk& blk,
                 loop_info info) {
  auto& loop_start = func.basic_blks.at(info.loop_start);
  LOG(TRACE) << "unroll loop starts at  " << info.loop_start << std::endl;
  LOG(TRACE) << "init_val: " << info.init_var << std::endl;
  LOG(TRACE) << "change : "
             << mir::inst::OpInst(info.init_var, info.init_var,
                                  info.change.second, info.change.first)
             << std::endl;
  LOG(TRACE) << "continue when: "
             << mir::inst::OpInst(mir::inst::VarId(0), info.init_var,
                                  info.cmp.second, info.cmp.first)
             << std::endl;
  Rewriter rwt(func, blk, {info.phi_var, info.init_var}, info.change_var);
  info.rewrite_jump_cond(func.basic_blks.at(info.loop_start));

  auto end_iter = func.basic_blks.end();
  end_iter--;
  end_iter--;

  // extra loop
  auto extra_loop_start = end_iter->first + 1;
  auto extra_loop = end_iter->first + 2;
  func.basic_blks.insert(
      {extra_loop_start, mir::inst::BasicBlk(extra_loop_start)});
  func.basic_blks.insert({extra_loop, mir::inst::BasicBlk(extra_loop)});
  auto& extra_loop_start_blk = func.basic_blks.at(extra_loop_start);
  auto& extra_loop_blk = func.basic_blks.at(extra_loop);
  extra_loop_start_blk.preceding =
      std::set<mir::types::LabelId>{loop_start.id, blk.id};
  extra_loop_blk.preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // original loop's end
  func.basic_blks.at(loop_start.jump.bb_false).preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // copy original loop insts in extra loop blk
  for (auto& inst : blk.inst) {
    extra_loop_blk.inst.push_back(
        std::unique_ptr<mir::inst::Inst>(inst->deep_copy()));
  }
  extra_loop_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, blk.jump.cond_or_ret,
      mir::inst::JumpKind::Loop);

  // after copy then can be rewrrote
  info.rewrite_jump_cond(blk);

  // init extra loop start 's insts
  int times = info.get_times();
  mir::inst::VarId new_change_var;
  auto insts = rwt.get_insts(times, new_change_var);
  auto new_phi = info.copy_var(info.init_var);
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
      new_phi, std::vector<mir::inst::VarId>{info.init_var, new_change_var}));
  auto cond = info.copy_var(blk.jump.cond_or_ret.value());
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
      cond, new_phi, info.cmp.second, info.cmp.first));
  extra_loop_start_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, cond, mir::inst::JumpKind::Loop);

  blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, blk.id, extra_loop_start_blk.id,
      blk.jump.cond_or_ret.value(), mir::inst::JumpKind::Loop);
  auto& inst = extra_loop_blk.inst.front();
  auto& i = *inst;
  assert(inst->inst_kind() == mir::inst::InstKind::Phi);
  auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  phiInst->vars.erase(
      std::find(phiInst->vars.begin(), phiInst->vars.end(), info.init_var));
  phiInst->vars.push_back(new_phi);
  blk.inst.clear();
  for (auto& inst : insts) {
    blk.inst.push_back(std::move(inst));
  }
  func.basic_blks.at(loop_start.jump.bb_false)
      .preceding.erase(loop_start.jump.bb_true);

  loop_start.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, loop_start.jump.bb_true,
      extra_loop_start_blk.id, loop_start.jump.cond_or_ret.value());
  // auto& end_loop_blk = func.basic_blks.at(loop_start.jump.bb_true);
  // for (auto iter = end_loop_blk.inst.begin();
  //      iter != end_loop_blk.inst.end() &&
  //      iter->get()->inst_kind() == mir::inst::InstKind::Phi;
  //      iter++) {
  //   auto& inst = *iter;
  //   auto& i = *inst;
  //   auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  //   if (phiInst->useVars().count(info.change_var)) {
  //     phiInst->vars.erase(std::find(phiInst->vars.begin(),
  //     phiInst->vars.end(),
  //                                   info.change_var));
  //   }
  //   if (times) {
  //     if (phiInst->useVars().count(info.init_var)) {
  //       phiInst->vars.erase(std::find(
  //           phiInst->vars.begin(), phiInst->vars.end(),
  //           info.init_var));
  //       phiInst->vars.push_back(new_change_var);
  //     }
  //   }
  // }
}